

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BufferBase.cpp
# Opt level: O1

vector<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_> * __thiscall
myvk::BufferBase::GetSrcMemoryBarriers
          (vector<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_>
           *__return_storage_ptr__,BufferBase *this,
          vector<VkBufferImageCopy,_std::allocator<VkBufferImageCopy>_> *regions,
          VkAccessFlags src_access_mask,VkAccessFlags dst_access_mask,uint32_t src_queue_family,
          uint32_t dst_queue_family)

{
  pointer pVVar1;
  pointer pVVar2;
  VkBuffer pVVar3;
  VkDeviceSize VVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  VkDeviceSize VVar8;
  ulong uVar9;
  allocator_type local_31;
  
  std::vector<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_>::vector
            (__return_storage_ptr__,
             ((long)(regions->
                    super__Vector_base<VkBufferImageCopy,_std::allocator<VkBufferImageCopy>_>).
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)(regions->
                    super__Vector_base<VkBufferImageCopy,_std::allocator<VkBufferImageCopy>_>).
                    _M_impl.super__Vector_impl_data._M_start >> 3) * 0x6db6db6db6db6db7,&local_31);
  pVVar1 = (regions->super__Vector_base<VkBufferImageCopy,_std::allocator<VkBufferImageCopy>_>).
           _M_impl.super__Vector_impl_data._M_start;
  lVar5 = (long)(regions->super__Vector_base<VkBufferImageCopy,_std::allocator<VkBufferImageCopy>_>)
                ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar1;
  if (lVar5 != 0) {
    uVar6 = (lVar5 >> 3) * 0x6db6db6db6db6db7;
    pVVar2 = (__return_storage_ptr__->
             super__Vector_base<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_>).
             _M_impl.super__Vector_impl_data._M_start;
    pVVar3 = this->m_buffer;
    VVar4 = this->m_size;
    uVar7 = 1;
    lVar5 = 0;
    do {
      *(undefined4 *)((long)&pVVar2->sType + lVar5) = 0x2c;
      VVar8 = VVar4;
      if (uVar6 - uVar7 != 0) {
        VVar8 = pVVar1[uVar7 & 0xffffffff].bufferOffset;
      }
      *(VkDeviceSize *)((long)&pVVar2->size + lVar5) =
           VVar8 - *(long *)((long)&pVVar1->bufferOffset + lVar5);
      *(VkBuffer *)((long)&pVVar2->buffer + lVar5) = pVVar3;
      *(undefined8 *)((long)&pVVar2->offset + lVar5) =
           *(undefined8 *)((long)&pVVar1->bufferOffset + lVar5);
      *(VkAccessFlags *)((long)&pVVar2->srcAccessMask + lVar5) = src_access_mask;
      *(VkAccessFlags *)((long)&pVVar2->dstAccessMask + lVar5) = dst_access_mask;
      *(uint32_t *)((long)&pVVar2->srcQueueFamilyIndex + lVar5) = src_queue_family;
      *(uint32_t *)((long)&pVVar2->dstQueueFamilyIndex + lVar5) = dst_queue_family;
      uVar9 = uVar7 & 0xffffffff;
      lVar5 = lVar5 + 0x38;
      uVar7 = uVar7 + 1;
    } while (uVar9 <= uVar6 && uVar6 - uVar9 != 0);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<VkBufferMemoryBarrier> BufferBase::GetSrcMemoryBarriers(const std::vector<VkBufferImageCopy> &regions,
                                                                    VkAccessFlags src_access_mask,
                                                                    VkAccessFlags dst_access_mask,
                                                                    uint32_t src_queue_family,
                                                                    uint32_t dst_queue_family) const {
	std::vector<VkBufferMemoryBarrier> barriers(regions.size());
	for (uint32_t i = 0; i < regions.size(); i++) {
		VkBufferMemoryBarrier &cur = barriers[i];
		cur.sType = VK_STRUCTURE_TYPE_BUFFER_MEMORY_BARRIER;
		cur.size = (i == regions.size() - 1) ? m_size - regions[i].bufferOffset
		                                     : regions[i + 1].bufferOffset - regions[i].bufferOffset;

		cur.buffer = m_buffer;
		cur.offset = regions[i].bufferOffset;
		cur.srcAccessMask = src_access_mask;
		cur.dstAccessMask = dst_access_mask;

		cur.srcQueueFamilyIndex = src_queue_family;
		cur.dstQueueFamilyIndex = dst_queue_family;
	}
	return barriers;
}